

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O2

void google::protobuf::StripWhitespace(string *str)

{
  byte *pbVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar2 = (uint)str->_M_string_length;
  uVar6 = 0;
  uVar4 = 0;
  if (0 < (int)uVar2) {
    uVar4 = (ulong)uVar2;
  }
  do {
    if (uVar4 == uVar6) {
LAB_002cdf20:
      uVar5 = uVar2 - (int)uVar4;
      if (uVar5 == 0) {
        str->_M_string_length = 0;
        *(str->_M_dataplus)._M_p = '\0';
      }
      else {
        if ((int)uVar4 != 0) {
          std::__cxx11::string::erase((ulong)str,0);
          uVar2 = uVar5;
        }
        iVar3 = 0;
        uVar4 = (ulong)uVar2;
        while (-1 < (int)(uVar4 - 1)) {
          pbVar1 = (byte *)std::__cxx11::string::at((ulong)str);
          if ((0x20 < (ulong)*pbVar1) || ((0x100003e00U >> ((ulong)*pbVar1 & 0x3f) & 1) == 0)) {
            if (iVar3 == 0) {
              return;
            }
            std::__cxx11::string::erase((ulong)str,uVar4);
            return;
          }
          iVar3 = iVar3 + 1;
          uVar4 = uVar4 - 1;
        }
      }
      return;
    }
    pbVar1 = (byte *)std::__cxx11::string::at((ulong)str);
    if ((0x20 < (ulong)*pbVar1) || ((0x100003e00U >> ((ulong)*pbVar1 & 0x3f) & 1) == 0)) {
      uVar4 = uVar6 & 0xffffffff;
      goto LAB_002cdf20;
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

void StripWhitespace(string* str) {
  int str_length = str->length();

  // Strip off leading whitespace.
  int first = 0;
  while (first < str_length && ascii_isspace(str->at(first))) {
    ++first;
  }
  // If entire string is white space.
  if (first == str_length) {
    str->clear();
    return;
  }
  if (first > 0) {
    str->erase(0, first);
    str_length -= first;
  }

  // Strip off trailing whitespace.
  int last = str_length - 1;
  while (last >= 0 && ascii_isspace(str->at(last))) {
    --last;
  }
  if (last != (str_length - 1) && last >= 0) {
    str->erase(last + 1, string::npos);
  }
}